

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

uint __thiscall wasm::Type::hasByteSize(Type *this)

{
  ulong uVar1;
  Type *pTVar2;
  Type *pTVar3;
  Type *pTVar4;
  bool bVar5;
  undefined1 local_30 [8];
  Iterator __begin2;
  
  uVar1 = this->id;
  if ((uVar1 & 1) == 0 || uVar1 < 7) {
    bVar5 = uVar1 - 2 < 5;
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_30 = (undefined1  [8])this;
    pTVar2 = (Type *)size(this);
    if (pTVar2 == (Type *)0x0) {
      bVar5 = true;
    }
    else {
      pTVar3 = (Type *)0x1;
      do {
        pTVar4 = pTVar3;
        pTVar3 = Iterator::operator*((Iterator *)local_30);
        bVar5 = pTVar3->id - 2 < 5;
        if (!bVar5) break;
        pTVar3 = (Type *)((long)&pTVar4->id + 1);
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar4
        ;
      } while (pTVar4 != pTVar2);
    }
  }
  return (uint)bVar5;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }